

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  IfcDerivedProfileDef *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa0,"IfcDerivedProfileDef");
  IfcProfileDef::IfcProfileDef(&this->super_IfcProfileDef,&PTR_construction_vtable_24__00fe61b8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDerivedProfileDef,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDerivedProfileDef,_3UL> *)
             &(this->super_IfcProfileDef).field_0x58,&PTR_construction_vtable_24__00fe61d8);
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xfe6150;
  *(undefined8 *)&this->field_0xa0 = 0xfe61a0;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x58 = 0xfe6178;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)&(this->super_IfcProfileDef).field_0x68
             ,(LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D>::Lazy
            (&this->Operator,(LazyObject *)0x0);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Label);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}